

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_demo.cpp
# Opt level: O2

void ImGui::ShowStyleEditor(ImGuiStyle *ref)

{
  undefined4 uVar1;
  undefined4 uVar2;
  ImFontAtlas *pIVar3;
  ImFont *this;
  ImFontConfig *pIVar4;
  float fVar5;
  float fVar6;
  ImVec2 pos;
  bool bVar7;
  bool bVar8;
  ImU32 IVar9;
  ImGuiStyle *v;
  char *pcVar10;
  size_t sVar11;
  ImGuiIO *pIVar12;
  ImFont **ppIVar13;
  ImFontGlyph *pIVar14;
  ImDrawList *this_00;
  int i;
  int iVar15;
  uint uVar16;
  long lVar17;
  ulong uVar18;
  int base;
  ImVec4 *pIVar19;
  void *ptr_id;
  int n_1;
  ImWchar c;
  int n;
  int iVar20;
  uint uVar21;
  ImGuiStyle *__dest;
  ImVec4 *pIVar22;
  int i_1;
  float fVar23;
  ImVec2 IVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  bool window_border;
  undefined7 uStack_d7;
  float fStack_d4;
  undefined8 uStack_d0;
  float local_bc;
  float *local_b8;
  uint local_ac;
  ImVec2 cell_p2;
  float local_78;
  float fStack_74;
  ImVec2 local_48;
  ImVec2 local_40;
  ImVec2 local_38;
  
  v = GetStyle();
  if (ShowStyleEditor(ImGuiStyle*)::ref_saved_style == '\0') {
    iVar20 = __cxa_guard_acquire(&ShowStyleEditor(ImGuiStyle*)::ref_saved_style);
    if (iVar20 != 0) {
      ImGuiStyle::ImGuiStyle(&ShowStyleEditor::ref_saved_style);
      __cxa_guard_release(&ShowStyleEditor(ImGuiStyle*)::ref_saved_style);
    }
  }
  if ((ref == (ImGuiStyle *)0x0) && ((ShowStyleEditor(ImGuiStyle*)::init & 1) == 0)) {
    memcpy(&ShowStyleEditor::ref_saved_style,v,0x3b0);
  }
  ShowStyleEditor(ImGuiStyle*)::init = 1;
  __dest = &ShowStyleEditor::ref_saved_style;
  if (ref != (ImGuiStyle *)0x0) {
    __dest = ref;
  }
  fVar23 = GetWindowWidth();
  PushItemWidth(fVar23 * 0.5);
  bVar7 = ShowStyleSelector("Colors##Selector");
  if (bVar7) {
    memcpy(&ShowStyleEditor::ref_saved_style,v,0x3b0);
  }
  ShowFontSelector("Fonts##Selector");
  local_b8 = &v->FrameRounding;
  bVar7 = SliderFloat("FrameRounding",local_b8,0.0,12.0,"%.0f",1.0);
  if (bVar7) {
    v->GrabRounding = v->FrameRounding;
  }
  window_border = 0.0 < v->WindowBorderSize;
  bVar7 = Checkbox("WindowBorder",&window_border);
  if (bVar7) {
    if (window_border == false) {
      fVar23 = 0.0;
    }
    else {
      fVar23 = 1.0;
    }
    v->WindowBorderSize = fVar23;
  }
  SameLine(0.0,-1.0);
  window_border = 0.0 < v->FrameBorderSize;
  bVar7 = Checkbox("FrameBorder",&window_border);
  if (bVar7) {
    if (window_border == false) {
      fVar23 = 0.0;
    }
    else {
      fVar23 = 1.0;
    }
    v->FrameBorderSize = fVar23;
  }
  SameLine(0.0,-1.0);
  window_border = 0.0 < v->PopupBorderSize;
  bVar7 = Checkbox("PopupBorder",&window_border);
  if (bVar7) {
    fVar23 = 1.0;
    if (window_border == false) {
      fVar23 = 0.0;
    }
    v->PopupBorderSize = fVar23;
  }
  _window_border = 0.0;
  fStack_d4 = 0.0;
  bVar7 = Button("Save Ref",(ImVec2 *)&window_border);
  if (bVar7) {
    memcpy(&ShowStyleEditor::ref_saved_style,v,0x3b0);
    memmove(__dest,v,0x3b0);
  }
  SameLine(0.0,-1.0);
  _window_border = 0.0;
  fStack_d4 = 0.0;
  bVar7 = Button("Revert Ref",(ImVec2 *)&window_border);
  if (bVar7) {
    memcpy(v,__dest,0x3b0);
  }
  SameLine(0.0,-1.0);
  HelpMarker(
            "Save/Revert in local non-persistent storage. Default Colors definition are not affected. Use \"Export\" below to save them somewhere."
            );
  Separator();
  bVar7 = BeginTabBar("##tabs",0);
  if (bVar7) {
    bVar7 = BeginTabItem("Sizes",(bool *)0x0,0);
    if (bVar7) {
      Text("Main");
      SliderFloat2("WindowPadding",&(v->WindowPadding).x,0.0,20.0,"%.0f",1.0);
      SliderFloat2("FramePadding",&(v->FramePadding).x,0.0,20.0,"%.0f",1.0);
      SliderFloat2("ItemSpacing",&(v->ItemSpacing).x,0.0,20.0,"%.0f",1.0);
      SliderFloat2("ItemInnerSpacing",&(v->ItemInnerSpacing).x,0.0,20.0,"%.0f",1.0);
      SliderFloat2("TouchExtraPadding",&(v->TouchExtraPadding).x,0.0,10.0,"%.0f",1.0);
      SliderFloat("IndentSpacing",&v->IndentSpacing,0.0,30.0,"%.0f",1.0);
      SliderFloat("ScrollbarSize",&v->ScrollbarSize,1.0,20.0,"%.0f",1.0);
      SliderFloat("GrabMinSize",&v->GrabMinSize,1.0,20.0,"%.0f",1.0);
      Text("Borders");
      SliderFloat("WindowBorderSize",&v->WindowBorderSize,0.0,1.0,"%.0f",1.0);
      SliderFloat("ChildBorderSize",&v->ChildBorderSize,0.0,1.0,"%.0f",1.0);
      SliderFloat("PopupBorderSize",&v->PopupBorderSize,0.0,1.0,"%.0f",1.0);
      SliderFloat("FrameBorderSize",&v->FrameBorderSize,0.0,1.0,"%.0f",1.0);
      SliderFloat("TabBorderSize",&v->TabBorderSize,0.0,1.0,"%.0f",1.0);
      Text("Rounding");
      SliderFloat("WindowRounding",&v->WindowRounding,0.0,12.0,"%.0f",1.0);
      SliderFloat("ChildRounding",&v->ChildRounding,0.0,12.0,"%.0f",1.0);
      SliderFloat("FrameRounding",local_b8,0.0,12.0,"%.0f",1.0);
      SliderFloat("PopupRounding",&v->PopupRounding,0.0,12.0,"%.0f",1.0);
      SliderFloat("ScrollbarRounding",&v->ScrollbarRounding,0.0,12.0,"%.0f",1.0);
      SliderFloat("GrabRounding",&v->GrabRounding,0.0,12.0,"%.0f",1.0);
      SliderFloat("TabRounding",&v->TabRounding,0.0,12.0,"%.0f",1.0);
      Text("Alignment");
      SliderFloat2("WindowTitleAlign",&(v->WindowTitleAlign).x,0.0,1.0,"%.2f",1.0);
      _window_border = (float)(v->WindowMenuButtonPosition + 1);
      bVar7 = Combo("WindowMenuButtonPosition",(int *)&window_border,"None",-1);
      if (bVar7) {
        v->WindowMenuButtonPosition = (int)_window_border + -1;
      }
      Combo("ColorButtonPosition",&v->ColorButtonPosition,"Left",-1);
      SliderFloat2("ButtonTextAlign",&(v->ButtonTextAlign).x,0.0,1.0,"%.2f",1.0);
      SameLine(0.0,-1.0);
      HelpMarker("Alignment applies when a button is larger than its text content.");
      SliderFloat2("SelectableTextAlign",&(v->SelectableTextAlign).x,0.0,1.0,"%.2f",1.0);
      SameLine(0.0,-1.0);
      HelpMarker("Alignment applies when a selectable is larger than its text content.");
      Text("Safe Area Padding");
      SameLine(0.0,-1.0);
      HelpMarker(
                "Adjust if you cannot see the edges of your screen (e.g. on a TV where scaling has not been configured)."
                );
      SliderFloat2("DisplaySafeAreaPadding",&(v->DisplaySafeAreaPadding).x,0.0,30.0,"%.0f",1.0);
      EndTabItem();
    }
    bVar7 = BeginTabItem("Colors",(bool *)0x0,0);
    if (bVar7) {
      _window_border = 0.0;
      fStack_d4 = 0.0;
      bVar7 = Button("Export",(ImVec2 *)&window_border);
      if (bVar7) {
        if (ShowStyleEditor::output_dest == 0) {
          LogToClipboard(-1);
        }
        else {
          LogToTTY(-1);
        }
        LogText("ImVec4* colors = ImGui::GetStyle().Colors;\n");
        pIVar22 = v->Colors;
        pIVar19 = __dest->Colors;
        for (lVar17 = 0; lVar17 != 0x30; lVar17 = lVar17 + 1) {
          pcVar10 = GetStyleColorName((ImGuiCol)lVar17);
          if (ShowStyleEditor::output_only_modified == true) {
            auVar25[0] = -(*(char *)&pIVar22->x == *(char *)&pIVar19->x);
            auVar25[1] = -(*(char *)((long)&pIVar22->x + 1) == *(char *)((long)&pIVar19->x + 1));
            auVar25[2] = -(*(char *)((long)&pIVar22->x + 2) == *(char *)((long)&pIVar19->x + 2));
            auVar25[3] = -(*(char *)((long)&pIVar22->x + 3) == *(char *)((long)&pIVar19->x + 3));
            auVar25[4] = -(*(char *)&pIVar22->y == *(char *)&pIVar19->y);
            auVar25[5] = -(*(char *)((long)&pIVar22->y + 1) == *(char *)((long)&pIVar19->y + 1));
            auVar25[6] = -(*(char *)((long)&pIVar22->y + 2) == *(char *)((long)&pIVar19->y + 2));
            auVar25[7] = -(*(char *)((long)&pIVar22->y + 3) == *(char *)((long)&pIVar19->y + 3));
            auVar25[8] = -(*(char *)&pIVar22->z == *(char *)&pIVar19->z);
            auVar25[9] = -(*(char *)((long)&pIVar22->z + 1) == *(char *)((long)&pIVar19->z + 1));
            auVar25[10] = -(*(char *)((long)&pIVar22->z + 2) == *(char *)((long)&pIVar19->z + 2));
            auVar25[0xb] = -(*(char *)((long)&pIVar22->z + 3) == *(char *)((long)&pIVar19->z + 3));
            auVar25[0xc] = -(*(char *)&pIVar22->w == *(char *)&pIVar19->w);
            auVar25[0xd] = -(*(char *)((long)&pIVar22->w + 1) == *(char *)((long)&pIVar19->w + 1));
            auVar25[0xe] = -(*(char *)((long)&pIVar22->w + 2) == *(char *)((long)&pIVar19->w + 2));
            auVar25[0xf] = -(*(char *)((long)&pIVar22->w + 3) == *(char *)((long)&pIVar19->w + 3));
            if ((ushort)((ushort)(SUB161(auVar25 >> 7,0) & 1) |
                         (ushort)(SUB161(auVar25 >> 0xf,0) & 1) << 1 |
                         (ushort)(SUB161(auVar25 >> 0x17,0) & 1) << 2 |
                         (ushort)(SUB161(auVar25 >> 0x1f,0) & 1) << 3 |
                         (ushort)(SUB161(auVar25 >> 0x27,0) & 1) << 4 |
                         (ushort)(SUB161(auVar25 >> 0x2f,0) & 1) << 5 |
                         (ushort)(SUB161(auVar25 >> 0x37,0) & 1) << 6 |
                         (ushort)(SUB161(auVar25 >> 0x3f,0) & 1) << 7 |
                         (ushort)(SUB161(auVar25 >> 0x47,0) & 1) << 8 |
                         (ushort)(SUB161(auVar25 >> 0x4f,0) & 1) << 9 |
                         (ushort)(SUB161(auVar25 >> 0x57,0) & 1) << 10 |
                         (ushort)(SUB161(auVar25 >> 0x5f,0) & 1) << 0xb |
                         (ushort)(SUB161(auVar25 >> 0x67,0) & 1) << 0xc |
                         (ushort)(SUB161(auVar25 >> 0x6f,0) & 1) << 0xd |
                         (ushort)(SUB161(auVar25 >> 0x77,0) & 1) << 0xe |
                        (ushort)(auVar25[0xf] >> 7) << 0xf) != 0xffff) goto LAB_001222ff;
          }
          else {
LAB_001222ff:
            sVar11 = strlen(pcVar10);
            LogText("colors[ImGuiCol_%s]%*s= ImVec4(%.2ff, %.2ff, %.2ff, %.2ff);\n",
                    (double)pIVar22->x,(double)pIVar22->y,(double)pIVar22->z,(double)pIVar22->w,
                    pcVar10,(ulong)(0x17 - (int)sVar11),"");
          }
          pIVar19 = pIVar19 + 1;
          pIVar22 = pIVar22 + 1;
        }
        LogFinish();
      }
      SameLine(0.0,-1.0);
      SetNextItemWidth(120.0);
      Combo("##output_type",&ShowStyleEditor::output_dest,"To Clipboard",-1);
      SameLine(0.0,-1.0);
      Checkbox("Only Modified Colors",&ShowStyleEditor::output_only_modified);
      if (ShowStyleEditor(ImGuiStyle*)::filter == '\0') {
        iVar20 = __cxa_guard_acquire(&ShowStyleEditor(ImGuiStyle*)::filter);
        if (iVar20 != 0) {
          ImGuiTextFilter::ImGuiTextFilter(&ShowStyleEditor::filter,"");
          __cxa_atexit(ImGuiTextFilter::~ImGuiTextFilter,&ShowStyleEditor::filter,&__dso_handle);
          __cxa_guard_release(&ShowStyleEditor(ImGuiStyle*)::filter);
        }
      }
      fVar23 = GetFontSize();
      ImGuiTextFilter::Draw(&ShowStyleEditor::filter,"Filter colors",fVar23 * 16.0);
      RadioButton("Opaque",&ShowStyleEditor::alpha_flags,0);
      SameLine(0.0,-1.0);
      RadioButton("Alpha",&ShowStyleEditor::alpha_flags,0x20000);
      SameLine(0.0,-1.0);
      RadioButton("Both",&ShowStyleEditor::alpha_flags,0x40000);
      SameLine(0.0,-1.0);
      HelpMarker(
                "In the color list:\nLeft-click on colored square to open color picker,\nRight-click to open edit options menu."
                );
      _window_border = 0.0;
      fStack_d4 = 0.0;
      BeginChild("##colors",(ImVec2 *)&window_border,true,0x80c000);
      PushItemWidth(-160.0);
      pIVar19 = v->Colors;
      pIVar22 = __dest->Colors;
      for (lVar17 = 0; lVar17 != 0x30; lVar17 = lVar17 + 1) {
        pcVar10 = GetStyleColorName((ImGuiCol)lVar17);
        bVar7 = ImGuiTextFilter::PassFilter(&ShowStyleEditor::filter,pcVar10,(char *)0x0);
        if (bVar7) {
          PushID((ImGuiCol)lVar17);
          ColorEdit4("##color",&pIVar19->x,ShowStyleEditor::alpha_flags | 0x10000);
          auVar26[0] = -(*(char *)&pIVar19->x == *(char *)&pIVar22->x);
          auVar26[1] = -(*(char *)((long)&pIVar19->x + 1) == *(char *)((long)&pIVar22->x + 1));
          auVar26[2] = -(*(char *)((long)&pIVar19->x + 2) == *(char *)((long)&pIVar22->x + 2));
          auVar26[3] = -(*(char *)((long)&pIVar19->x + 3) == *(char *)((long)&pIVar22->x + 3));
          auVar26[4] = -(*(char *)&pIVar19->y == *(char *)&pIVar22->y);
          auVar26[5] = -(*(char *)((long)&pIVar19->y + 1) == *(char *)((long)&pIVar22->y + 1));
          auVar26[6] = -(*(char *)((long)&pIVar19->y + 2) == *(char *)((long)&pIVar22->y + 2));
          auVar26[7] = -(*(char *)((long)&pIVar19->y + 3) == *(char *)((long)&pIVar22->y + 3));
          auVar26[8] = -(*(char *)&pIVar19->z == *(char *)&pIVar22->z);
          auVar26[9] = -(*(char *)((long)&pIVar19->z + 1) == *(char *)((long)&pIVar22->z + 1));
          auVar26[10] = -(*(char *)((long)&pIVar19->z + 2) == *(char *)((long)&pIVar22->z + 2));
          auVar26[0xb] = -(*(char *)((long)&pIVar19->z + 3) == *(char *)((long)&pIVar22->z + 3));
          auVar26[0xc] = -(*(char *)&pIVar19->w == *(char *)&pIVar22->w);
          auVar26[0xd] = -(*(char *)((long)&pIVar19->w + 1) == *(char *)((long)&pIVar22->w + 1));
          auVar26[0xe] = -(*(char *)((long)&pIVar19->w + 2) == *(char *)((long)&pIVar22->w + 2));
          auVar26[0xf] = -(*(char *)((long)&pIVar19->w + 3) == *(char *)((long)&pIVar22->w + 3));
          if ((ushort)((ushort)(SUB161(auVar26 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar26 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar26 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar26 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar26 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar26 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar26 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar26 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar26 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar26 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar26 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar26 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar26 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar26 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar26 >> 0x77,0) & 1) << 0xe |
                      (ushort)(auVar26[0xf] >> 7) << 0xf) != 0xffff) {
            SameLine(0.0,(v->ItemInnerSpacing).x);
            _window_border = 0.0;
            fStack_d4 = 0.0;
            bVar7 = Button("Save",(ImVec2 *)&window_border);
            if (bVar7) {
              fVar23 = pIVar19->y;
              fVar5 = pIVar19->z;
              fVar6 = pIVar19->w;
              pIVar22->x = pIVar19->x;
              pIVar22->y = fVar23;
              pIVar22->z = fVar5;
              pIVar22->w = fVar6;
            }
            SameLine(0.0,(v->ItemInnerSpacing).x);
            _window_border = 0.0;
            fStack_d4 = 0.0;
            bVar7 = Button("Revert",(ImVec2 *)&window_border);
            if (bVar7) {
              fVar23 = pIVar22->y;
              fVar5 = pIVar22->z;
              fVar6 = pIVar22->w;
              pIVar19->x = pIVar22->x;
              pIVar19->y = fVar23;
              pIVar19->z = fVar5;
              pIVar19->w = fVar6;
            }
          }
          SameLine(0.0,(v->ItemInnerSpacing).x);
          TextUnformatted(pcVar10,(char *)0x0);
          PopID();
        }
        pIVar22 = pIVar22 + 1;
        pIVar19 = pIVar19 + 1;
      }
      PopItemWidth();
      EndChild();
      EndTabItem();
    }
    bVar7 = BeginTabItem("Fonts",(bool *)0x0,0);
    if (bVar7) {
      pIVar12 = GetIO();
      pIVar3 = pIVar12->Fonts;
      HelpMarker("Read FAQ and misc/fonts/README.txt for details on font loading.");
      PushItemWidth(120.0);
      uVar16 = 0;
      while ((int)uVar16 < (pIVar3->Fonts).Size) {
        ppIVar13 = ImVector<ImFont_*>::operator[](&pIVar3->Fonts,uVar16);
        this = *ppIVar13;
        PushID(this);
        pcVar10 = this->ConfigData->Name;
        if (this->ConfigData == (ImFontConfig *)0x0) {
          pcVar10 = "";
        }
        local_ac = uVar16;
        bVar7 = TreeNode(this,"Font %d: \"%s\"\n%.2f px, %d glyphs, %d file(s)",
                         (double)this->FontSize,(ulong)uVar16,pcVar10,
                         (ulong)(uint)(this->Glyphs).Size,(ulong)(uint)(int)this->ConfigDataCount);
        SameLine(0.0,-1.0);
        bVar8 = SmallButton("Set as default");
        if (bVar8) {
          pIVar12->FontDefault = this;
        }
        if (bVar7) {
          PushFont((ImFont *)0x122699);
          Text("The quick brown fox jumps over the lazy dog");
          PopFont();
          DragFloat("Font scale",&this->Scale,0.005,0.3,2.0,"%.1f",1.0);
          SameLine(0.0,-1.0);
          HelpMarker(
                    "Note than the default embedded font is NOT meant to be scaled.\n\nFont are currently rendered into bitmaps at a given size at the time of building the atlas. You may oversample them to get some flexibility with scaling. You can also render at multiple sizes and select which one to use at runtime.\n\n(Glimmer of hope: the atlas system should hopefully be rewritten in the future to make scaling more natural and automatic.)"
                    );
          InputFloat("Font offset",&(this->DisplayOffset).y,1.0,1.0,"%.0f",0);
          Text("Ascent: %f, Descent: %f, Height: %f",(double)this->Ascent,(double)this->Descent,
               (double)(this->Ascent - this->Descent));
          Text("Fallback character: \'%c\' (U+%04X)",(ulong)this->FallbackChar);
          Text("Ellipsis character: \'%c\' (U+%04X)",(ulong)this->EllipsisChar);
          fVar23 = (float)this->MetricsTotalSurface;
          if (fVar23 < 0.0) {
            fVar23 = sqrtf(fVar23);
          }
          else {
            fVar23 = SQRT(fVar23);
          }
          Text("Texture surface: %d pixels (approx) ~ %dx%d",(ulong)(uint)this->MetricsTotalSurface,
               (ulong)(uint)(int)fVar23);
          lVar17 = 0x56;
          for (uVar18 = 0; (long)uVar18 < (long)this->ConfigDataCount; uVar18 = uVar18 + 1) {
            pIVar4 = this->ConfigData;
            if (pIVar4 != (ImFontConfig *)0x0) {
              BulletText("Input %d: \'%s\', Oversample: (%d,%d), PixelSnapH: %d",uVar18 & 0xffffffff
                         ,pIVar4->Name + lVar17 + -0x56,
                         (ulong)*(uint *)((long)pIVar4 + lVar17 + -0x3e),
                         (ulong)*(uint *)((long)pIVar4 + lVar17 + -0x3a),
                         (ulong)*(byte *)((long)pIVar4 + lVar17 + -0x36));
            }
            lVar17 = lVar17 + 0x88;
          }
          bVar7 = TreeNode("Glyphs","Glyphs (%d)",(ulong)(uint)(this->Glyphs).Size);
          if (bVar7) {
            for (ptr_id = (void *)0x0; ptr_id < (void *)0x10000;
                ptr_id = (void *)((long)ptr_id + 0x100)) {
              uVar18 = 0;
              for (iVar20 = 0; iVar15 = (int)uVar18, iVar20 != 0x100; iVar20 = iVar20 + 1) {
                pIVar14 = ImFont::FindGlyphNoFallback(this,(short)iVar20 + (short)ptr_id);
                uVar18 = (ulong)((iVar15 + 1) - (uint)(pIVar14 == (ImFontGlyph *)0x0));
              }
              if (iVar15 != 0) {
                pcVar10 = "glyphs";
                if (iVar15 == 1) {
                  pcVar10 = "glyph";
                }
                bVar7 = TreeNode(ptr_id,"U+%04X..U+%04X (%d %s)",(ulong)ptr_id & 0xffffffff,
                                 (ulong)((uint)ptr_id | 0xff),uVar18,pcVar10);
                if (bVar7) {
                  local_b8 = (float *)CONCAT44(local_b8._4_4_,this->FontSize);
                  local_bc = (v->ItemSpacing).y + this->FontSize;
                  IVar24 = GetCursorScreenPos();
                  this_00 = GetWindowDrawList();
                  fStack_74 = IVar24.y;
                  uVar18 = 0;
                  while (uVar16 = (uint)uVar18, uVar16 != 0x100) {
                    local_78 = IVar24.x;
                    _window_border = (float)(uVar16 & 0xf) * local_bc + local_78;
                    fStack_d4 = (float)(int)(uVar18 >> 4) * local_bc + fStack_74;
                    cell_p2.y = fStack_d4 + local_b8._0_4_;
                    cell_p2.x = _window_border + local_b8._0_4_;
                    uVar21 = (uint)ptr_id + uVar16;
                    c = (ImWchar)uVar21;
                    pIVar14 = ImFont::FindGlyphNoFallback(this,c);
                    IVar9 = 0x64ffffff;
                    if (pIVar14 == (ImFontGlyph *)0x0) {
                      IVar9 = 0x32ffffff;
                    }
                    ImDrawList::AddRect(this_00,(ImVec2 *)&window_border,&cell_p2,IVar9,0.0,0xf,1.0)
                    ;
                    pos = _window_border;
                    if (pIVar14 != (ImFontGlyph *)0x0) {
                      IVar9 = GetColorU32(0,1.0);
                      ImFont::RenderChar(this,this_00,local_b8._0_4_,pos,IVar9,c);
                      bVar7 = IsMouseHoveringRect((ImVec2 *)&window_border,&cell_p2,true);
                      if (bVar7) {
                        BeginTooltip();
                        Text("Codepoint: U+%04X",(ulong)uVar21);
                        Separator();
                        Text("AdvanceX: %.1f",(double)pIVar14->AdvanceX);
                        Text("Pos: (%.2f,%.2f)->(%.2f,%.2f)",(double)pIVar14->X0,(double)pIVar14->Y0
                             ,(double)pIVar14->X1,(double)pIVar14->Y1);
                        Text("UV: (%.3f,%.3f)->(%.3f,%.3f)",(double)pIVar14->U0,(double)pIVar14->V0,
                             (double)pIVar14->U1,(double)pIVar14->V1);
                        EndTooltip();
                      }
                    }
                    uVar18 = (ulong)(uVar16 + 1);
                  }
                  fStack_d4 = local_bc * 16.0;
                  _window_border = local_bc * 16.0;
                  Dummy((ImVec2 *)&window_border);
                  TreePop();
                }
              }
            }
            TreePop();
          }
          TreePop();
        }
        PopID();
        uVar16 = local_ac + 1;
      }
      bVar7 = TreeNode("Atlas texture","Atlas texture (%dx%d pixels)",(ulong)(uint)pIVar3->TexWidth,
                       (ulong)(uint)pIVar3->TexHeight);
      if (bVar7) {
        _window_border = 1.0;
        fStack_d4 = 1.0;
        uStack_d0._0_4_ = 1.0;
        uStack_d0._4_4_ = 1.0;
        cell_p2.x = 1.0;
        cell_p2.y = 1.0;
        uVar1 = pIVar3->TexWidth;
        uVar2 = pIVar3->TexHeight;
        local_38.x = (float)(int)uVar1;
        local_38.y = (float)(int)uVar2;
        local_40.x = 0.0;
        local_40.y = 0.0;
        local_48.x = 1.0;
        local_48.y = 1.0;
        Image(pIVar3->TexID,&local_38,&local_40,&local_48,(ImVec4 *)&window_border,
              (ImVec4 *)&cell_p2);
        TreePop();
      }
      HelpMarker(
                "Those are old settings provided for convenience.\nHowever, the _correct_ way of scaling your UI is currently to reload your font at the designed size, rebuild the font atlas, and call style.ScaleAllSizes() on a reference ImGuiStyle structure."
                );
      bVar7 = DragFloat("window scale",&ShowStyleEditor::window_scale,0.005,0.3,2.0,"%.2f",1.0);
      if (bVar7) {
        SetWindowFontScale(ShowStyleEditor::window_scale);
      }
      DragFloat("global scale",&pIVar12->FontGlobalScale,0.005,0.3,2.0,"%.2f",1.0);
      PopItemWidth();
      EndTabItem();
    }
    bVar7 = BeginTabItem("Rendering",(bool *)0x0,0);
    if (bVar7) {
      Checkbox("Anti-aliased lines",&v->AntiAliasedLines);
      SameLine(0.0,-1.0);
      HelpMarker(
                "When disabling anti-aliasing lines, you\'ll probably want to disable borders in your style as well."
                );
      Checkbox("Anti-aliased fill",&v->AntiAliasedFill);
      PushItemWidth(100.0);
      DragFloat("Curve Tessellation Tolerance",&v->CurveTessellationTol,0.02,0.1,3.4028235e+38,
                "%.2f",2.0);
      if (v->CurveTessellationTol <= 0.1 && v->CurveTessellationTol != 0.1) {
        v->CurveTessellationTol = 0.1;
      }
      DragFloat("Global Alpha",&v->Alpha,0.005,0.2,1.0,"%.2f",1.0);
      PopItemWidth();
      EndTabItem();
    }
    EndTabBar();
  }
  PopItemWidth();
  return;
}

Assistant:

void ImGui::ShowStyleEditor(ImGuiStyle* ref)
{
    // You can pass in a reference ImGuiStyle structure to compare to, revert to and save to (else it compares to an internally stored reference)
    ImGuiStyle& style = ImGui::GetStyle();
    static ImGuiStyle ref_saved_style;

    // Default to using internal storage as reference
    static bool init = true;
    if (init && ref == NULL)
        ref_saved_style = style;
    init = false;
    if (ref == NULL)
        ref = &ref_saved_style;

    ImGui::PushItemWidth(ImGui::GetWindowWidth() * 0.50f);

    if (ImGui::ShowStyleSelector("Colors##Selector"))
        ref_saved_style = style;
    ImGui::ShowFontSelector("Fonts##Selector");

    // Simplified Settings
    if (ImGui::SliderFloat("FrameRounding", &style.FrameRounding, 0.0f, 12.0f, "%.0f"))
        style.GrabRounding = style.FrameRounding; // Make GrabRounding always the same value as FrameRounding
    { bool window_border = (style.WindowBorderSize > 0.0f); if (ImGui::Checkbox("WindowBorder", &window_border)) style.WindowBorderSize = window_border ? 1.0f : 0.0f; }
    ImGui::SameLine();
    { bool frame_border = (style.FrameBorderSize > 0.0f); if (ImGui::Checkbox("FrameBorder", &frame_border)) style.FrameBorderSize = frame_border ? 1.0f : 0.0f; }
    ImGui::SameLine();
    { bool popup_border = (style.PopupBorderSize > 0.0f); if (ImGui::Checkbox("PopupBorder", &popup_border)) style.PopupBorderSize = popup_border ? 1.0f : 0.0f; }

    // Save/Revert button
    if (ImGui::Button("Save Ref"))
        *ref = ref_saved_style = style;
    ImGui::SameLine();
    if (ImGui::Button("Revert Ref"))
        style = *ref;
    ImGui::SameLine();
    HelpMarker("Save/Revert in local non-persistent storage. Default Colors definition are not affected. Use \"Export\" below to save them somewhere.");

    ImGui::Separator();

    if (ImGui::BeginTabBar("##tabs", ImGuiTabBarFlags_None))
    {
        if (ImGui::BeginTabItem("Sizes"))
        {
            ImGui::Text("Main");
            ImGui::SliderFloat2("WindowPadding", (float*)&style.WindowPadding, 0.0f, 20.0f, "%.0f");
            ImGui::SliderFloat2("FramePadding", (float*)&style.FramePadding, 0.0f, 20.0f, "%.0f");
            ImGui::SliderFloat2("ItemSpacing", (float*)&style.ItemSpacing, 0.0f, 20.0f, "%.0f");
            ImGui::SliderFloat2("ItemInnerSpacing", (float*)&style.ItemInnerSpacing, 0.0f, 20.0f, "%.0f");
            ImGui::SliderFloat2("TouchExtraPadding", (float*)&style.TouchExtraPadding, 0.0f, 10.0f, "%.0f");
            ImGui::SliderFloat("IndentSpacing", &style.IndentSpacing, 0.0f, 30.0f, "%.0f");
            ImGui::SliderFloat("ScrollbarSize", &style.ScrollbarSize, 1.0f, 20.0f, "%.0f");
            ImGui::SliderFloat("GrabMinSize", &style.GrabMinSize, 1.0f, 20.0f, "%.0f");
            ImGui::Text("Borders");
            ImGui::SliderFloat("WindowBorderSize", &style.WindowBorderSize, 0.0f, 1.0f, "%.0f");
            ImGui::SliderFloat("ChildBorderSize", &style.ChildBorderSize, 0.0f, 1.0f, "%.0f");
            ImGui::SliderFloat("PopupBorderSize", &style.PopupBorderSize, 0.0f, 1.0f, "%.0f");
            ImGui::SliderFloat("FrameBorderSize", &style.FrameBorderSize, 0.0f, 1.0f, "%.0f");
            ImGui::SliderFloat("TabBorderSize", &style.TabBorderSize, 0.0f, 1.0f, "%.0f");
            ImGui::Text("Rounding");
            ImGui::SliderFloat("WindowRounding", &style.WindowRounding, 0.0f, 12.0f, "%.0f");
            ImGui::SliderFloat("ChildRounding", &style.ChildRounding, 0.0f, 12.0f, "%.0f");
            ImGui::SliderFloat("FrameRounding", &style.FrameRounding, 0.0f, 12.0f, "%.0f");
            ImGui::SliderFloat("PopupRounding", &style.PopupRounding, 0.0f, 12.0f, "%.0f");
            ImGui::SliderFloat("ScrollbarRounding", &style.ScrollbarRounding, 0.0f, 12.0f, "%.0f");
            ImGui::SliderFloat("GrabRounding", &style.GrabRounding, 0.0f, 12.0f, "%.0f");
            ImGui::SliderFloat("TabRounding", &style.TabRounding, 0.0f, 12.0f, "%.0f");
            ImGui::Text("Alignment");
            ImGui::SliderFloat2("WindowTitleAlign", (float*)&style.WindowTitleAlign, 0.0f, 1.0f, "%.2f");
            int window_menu_button_position = style.WindowMenuButtonPosition + 1;
            if (ImGui::Combo("WindowMenuButtonPosition", (int*)&window_menu_button_position, "None\0Left\0Right\0"))
                style.WindowMenuButtonPosition = window_menu_button_position - 1;
            ImGui::Combo("ColorButtonPosition", (int*)&style.ColorButtonPosition, "Left\0Right\0");
            ImGui::SliderFloat2("ButtonTextAlign", (float*)&style.ButtonTextAlign, 0.0f, 1.0f, "%.2f"); ImGui::SameLine(); HelpMarker("Alignment applies when a button is larger than its text content.");
            ImGui::SliderFloat2("SelectableTextAlign", (float*)&style.SelectableTextAlign, 0.0f, 1.0f, "%.2f"); ImGui::SameLine(); HelpMarker("Alignment applies when a selectable is larger than its text content.");
            ImGui::Text("Safe Area Padding"); ImGui::SameLine(); HelpMarker("Adjust if you cannot see the edges of your screen (e.g. on a TV where scaling has not been configured).");
            ImGui::SliderFloat2("DisplaySafeAreaPadding", (float*)&style.DisplaySafeAreaPadding, 0.0f, 30.0f, "%.0f");
            ImGui::EndTabItem();
        }

        if (ImGui::BeginTabItem("Colors"))
        {
            static int output_dest = 0;
            static bool output_only_modified = true;
            if (ImGui::Button("Export"))
            {
                if (output_dest == 0)
                    ImGui::LogToClipboard();
                else
                    ImGui::LogToTTY();
                ImGui::LogText("ImVec4* colors = ImGui::GetStyle().Colors;" IM_NEWLINE);
                for (int i = 0; i < ImGuiCol_COUNT; i++)
                {
                    const ImVec4& col = style.Colors[i];
                    const char* name = ImGui::GetStyleColorName(i);
                    if (!output_only_modified || memcmp(&col, &ref->Colors[i], sizeof(ImVec4)) != 0)
                        ImGui::LogText("colors[ImGuiCol_%s]%*s= ImVec4(%.2ff, %.2ff, %.2ff, %.2ff);" IM_NEWLINE, name, 23 - (int)strlen(name), "", col.x, col.y, col.z, col.w);
                }
                ImGui::LogFinish();
            }
            ImGui::SameLine(); ImGui::SetNextItemWidth(120); ImGui::Combo("##output_type", &output_dest, "To Clipboard\0To TTY\0");
            ImGui::SameLine(); ImGui::Checkbox("Only Modified Colors", &output_only_modified);

            static ImGuiTextFilter filter;
            filter.Draw("Filter colors", ImGui::GetFontSize() * 16);

            static ImGuiColorEditFlags alpha_flags = 0;
            ImGui::RadioButton("Opaque", &alpha_flags, 0); ImGui::SameLine();
            ImGui::RadioButton("Alpha", &alpha_flags, ImGuiColorEditFlags_AlphaPreview); ImGui::SameLine();
            ImGui::RadioButton("Both", &alpha_flags, ImGuiColorEditFlags_AlphaPreviewHalf); ImGui::SameLine();
            HelpMarker("In the color list:\nLeft-click on colored square to open color picker,\nRight-click to open edit options menu.");

            ImGui::BeginChild("##colors", ImVec2(0, 0), true, ImGuiWindowFlags_AlwaysVerticalScrollbar | ImGuiWindowFlags_AlwaysHorizontalScrollbar | ImGuiWindowFlags_NavFlattened);
            ImGui::PushItemWidth(-160);
            for (int i = 0; i < ImGuiCol_COUNT; i++)
            {
                const char* name = ImGui::GetStyleColorName(i);
                if (!filter.PassFilter(name))
                    continue;
                ImGui::PushID(i);
                ImGui::ColorEdit4("##color", (float*)&style.Colors[i], ImGuiColorEditFlags_AlphaBar | alpha_flags);
                if (memcmp(&style.Colors[i], &ref->Colors[i], sizeof(ImVec4)) != 0)
                {
                    // Tips: in a real user application, you may want to merge and use an icon font into the main font, so instead of "Save"/"Revert" you'd use icons.
                    // Read the FAQ and misc/fonts/README.txt about using icon fonts. It's really easy and super convenient!
                    ImGui::SameLine(0.0f, style.ItemInnerSpacing.x); if (ImGui::Button("Save")) ref->Colors[i] = style.Colors[i];
                    ImGui::SameLine(0.0f, style.ItemInnerSpacing.x); if (ImGui::Button("Revert")) style.Colors[i] = ref->Colors[i];
                }
                ImGui::SameLine(0.0f, style.ItemInnerSpacing.x);
                ImGui::TextUnformatted(name);
                ImGui::PopID();
            }
            ImGui::PopItemWidth();
            ImGui::EndChild();

            ImGui::EndTabItem();
        }

        if (ImGui::BeginTabItem("Fonts"))
        {
            ImGuiIO& io = ImGui::GetIO();
            ImFontAtlas* atlas = io.Fonts;
            HelpMarker("Read FAQ and misc/fonts/README.txt for details on font loading.");
            ImGui::PushItemWidth(120);
            for (int i = 0; i < atlas->Fonts.Size; i++)
            {
                ImFont* font = atlas->Fonts[i];
                ImGui::PushID(font);
                bool font_details_opened = ImGui::TreeNode(font, "Font %d: \"%s\"\n%.2f px, %d glyphs, %d file(s)", i, font->ConfigData ? font->ConfigData[0].Name : "", font->FontSize, font->Glyphs.Size, font->ConfigDataCount);
                ImGui::SameLine(); if (ImGui::SmallButton("Set as default")) { io.FontDefault = font; }
                if (font_details_opened)
                {
                    ImGui::PushFont(font);
                    ImGui::Text("The quick brown fox jumps over the lazy dog");
                    ImGui::PopFont();
                    ImGui::DragFloat("Font scale", &font->Scale, 0.005f, 0.3f, 2.0f, "%.1f");   // Scale only this font
                    ImGui::SameLine(); HelpMarker("Note than the default embedded font is NOT meant to be scaled.\n\nFont are currently rendered into bitmaps at a given size at the time of building the atlas. You may oversample them to get some flexibility with scaling. You can also render at multiple sizes and select which one to use at runtime.\n\n(Glimmer of hope: the atlas system should hopefully be rewritten in the future to make scaling more natural and automatic.)");
                    ImGui::InputFloat("Font offset", &font->DisplayOffset.y, 1, 1, "%.0f");
                    ImGui::Text("Ascent: %f, Descent: %f, Height: %f", font->Ascent, font->Descent, font->Ascent - font->Descent);
                    ImGui::Text("Fallback character: '%c' (U+%04X)", font->FallbackChar, font->FallbackChar);
                    ImGui::Text("Ellipsis character: '%c' (U+%04X)", font->EllipsisChar, font->EllipsisChar);
                    const float surface_sqrt = sqrtf((float)font->MetricsTotalSurface);
                    ImGui::Text("Texture surface: %d pixels (approx) ~ %dx%d", font->MetricsTotalSurface, (int)surface_sqrt, (int)surface_sqrt);
                    for (int config_i = 0; config_i < font->ConfigDataCount; config_i++)
                        if (const ImFontConfig* cfg = &font->ConfigData[config_i])
                            ImGui::BulletText("Input %d: \'%s\', Oversample: (%d,%d), PixelSnapH: %d", config_i, cfg->Name, cfg->OversampleH, cfg->OversampleV, cfg->PixelSnapH);
                    if (ImGui::TreeNode("Glyphs", "Glyphs (%d)", font->Glyphs.Size))
                    {
                        // Display all glyphs of the fonts in separate pages of 256 characters
                        for (int base = 0; base < 0x10000; base += 256)
                        {
                            int count = 0;
                            for (int n = 0; n < 256; n++)
                                count += font->FindGlyphNoFallback((ImWchar)(base + n)) ? 1 : 0;
                            if (count > 0 && ImGui::TreeNode((void*)(intptr_t)base, "U+%04X..U+%04X (%d %s)", base, base + 255, count, count > 1 ? "glyphs" : "glyph"))
                            {
                                float cell_size = font->FontSize * 1;
                                float cell_spacing = style.ItemSpacing.y;
                                ImVec2 base_pos = ImGui::GetCursorScreenPos();
                                ImDrawList* draw_list = ImGui::GetWindowDrawList();
                                for (int n = 0; n < 256; n++)
                                {
                                    ImVec2 cell_p1(base_pos.x + (n % 16) * (cell_size + cell_spacing), base_pos.y + (n / 16) * (cell_size + cell_spacing));
                                    ImVec2 cell_p2(cell_p1.x + cell_size, cell_p1.y + cell_size);
                                    const ImFontGlyph* glyph = font->FindGlyphNoFallback((ImWchar)(base + n));
                                    draw_list->AddRect(cell_p1, cell_p2, glyph ? IM_COL32(255, 255, 255, 100) : IM_COL32(255, 255, 255, 50));
                                    if (glyph)
                                        font->RenderChar(draw_list, cell_size, cell_p1, ImGui::GetColorU32(ImGuiCol_Text), (ImWchar)(base + n)); // We use ImFont::RenderChar as a shortcut because we don't have UTF-8 conversion functions available to generate a string.
                                    if (glyph && ImGui::IsMouseHoveringRect(cell_p1, cell_p2))
                                    {
                                        ImGui::BeginTooltip();
                                        ImGui::Text("Codepoint: U+%04X", base + n);
                                        ImGui::Separator();
                                        ImGui::Text("AdvanceX: %.1f", glyph->AdvanceX);
                                        ImGui::Text("Pos: (%.2f,%.2f)->(%.2f,%.2f)", glyph->X0, glyph->Y0, glyph->X1, glyph->Y1);
                                        ImGui::Text("UV: (%.3f,%.3f)->(%.3f,%.3f)", glyph->U0, glyph->V0, glyph->U1, glyph->V1);
                                        ImGui::EndTooltip();
                                    }
                                }
                                ImGui::Dummy(ImVec2((cell_size + cell_spacing) * 16, (cell_size + cell_spacing) * 16));
                                ImGui::TreePop();
                            }
                        }
                        ImGui::TreePop();
                    }
                    ImGui::TreePop();
                }
                ImGui::PopID();
            }
            if (ImGui::TreeNode("Atlas texture", "Atlas texture (%dx%d pixels)", atlas->TexWidth, atlas->TexHeight))
            {
                ImVec4 tint_col = ImVec4(1.0f, 1.0f, 1.0f, 1.0f);
                ImVec4 border_col = ImVec4(1.0f, 1.0f, 1.0f, 0.5f);
                ImGui::Image(atlas->TexID, ImVec2((float)atlas->TexWidth, (float)atlas->TexHeight), ImVec2(0, 0), ImVec2(1, 1), tint_col, border_col);
                ImGui::TreePop();
            }

            HelpMarker("Those are old settings provided for convenience.\nHowever, the _correct_ way of scaling your UI is currently to reload your font at the designed size, rebuild the font atlas, and call style.ScaleAllSizes() on a reference ImGuiStyle structure.");
            static float window_scale = 1.0f;
            if (ImGui::DragFloat("window scale", &window_scale, 0.005f, 0.3f, 2.0f, "%.2f"))   // scale only this window
                ImGui::SetWindowFontScale(window_scale);
            ImGui::DragFloat("global scale", &io.FontGlobalScale, 0.005f, 0.3f, 2.0f, "%.2f");      // scale everything
            ImGui::PopItemWidth();

            ImGui::EndTabItem();
        }

        if (ImGui::BeginTabItem("Rendering"))
        {
            ImGui::Checkbox("Anti-aliased lines", &style.AntiAliasedLines); ImGui::SameLine(); HelpMarker("When disabling anti-aliasing lines, you'll probably want to disable borders in your style as well.");
            ImGui::Checkbox("Anti-aliased fill", &style.AntiAliasedFill);
            ImGui::PushItemWidth(100);
            ImGui::DragFloat("Curve Tessellation Tolerance", &style.CurveTessellationTol, 0.02f, 0.10f, FLT_MAX, "%.2f", 2.0f);
            if (style.CurveTessellationTol < 0.10f) style.CurveTessellationTol = 0.10f;
            ImGui::DragFloat("Global Alpha", &style.Alpha, 0.005f, 0.20f, 1.0f, "%.2f"); // Not exposing zero here so user doesn't "lose" the UI (zero alpha clips all widgets). But application code could have a toggle to switch between zero and non-zero.
            ImGui::PopItemWidth();

            ImGui::EndTabItem();
        }

        ImGui::EndTabBar();
    }

    ImGui::PopItemWidth();
}